

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::formatNode(TaggerImpl *this,Node *node,char *out,size_t len)

{
  char *pcVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  
  pLVar3 = mutable_lattice(this);
  iVar2 = (*pLVar3->_vptr_Lattice[0x1c])(pLVar3,node,out,len);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar4 == (char *)0x0) {
    pLVar3 = mutable_lattice(this);
    iVar2 = (*pLVar3->_vptr_Lattice[0x24])(pLVar3);
    pcVar1 = (char *)(this->what_)._M_string_length;
    strlen((char *)CONCAT44(extraout_var_00,iVar2));
    pcVar4 = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar1,CONCAT44(extraout_var_00,iVar2));
  }
  return pcVar4;
}

Assistant:

const char* TaggerImpl::formatNode(const Node* node,
                                   char *out, size_t len) {
  const char *result = mutable_lattice()->toString(node, out, len);
  if (!result) {
    set_what(mutable_lattice()->what());
    return 0;
  }
  return result;
}